

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

int png_check_fp_number(png_const_charp string,size_t size,int *statep,png_size_tp whereami)

{
  uint uVar1;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  
  uVar1 = *statep;
  sVar2 = *whereami;
  do {
    if (size <= sVar2) goto LAB_0011c1f0;
    iVar3 = 5;
    switch(string[sVar2]) {
    case '+':
      uVar4 = 4;
      break;
    case ',':
    case '/':
    case ':':
    case ';':
    case '<':
    case '=':
    case '>':
    case '?':
    case '@':
    case 'A':
    case 'B':
    case 'C':
    case 'D':
      goto switchD_0011c107_caseD_2c;
    case '-':
      uVar4 = 0x84;
      break;
    case '.':
      uVar4 = 0x10;
      break;
    case '0':
      uVar4 = 8;
      break;
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      uVar4 = 0x108;
      break;
    case 'E':
switchD_0011c107_caseD_45:
      uVar4 = 0x20;
      break;
    default:
      if (string[sVar2] == 'e') goto switchD_0011c107_caseD_45;
      goto switchD_0011c107_caseD_2c;
    }
    switch((uVar4 & 0x3c) + (uVar1 & 3)) {
    case 4:
      halt_baddata();
    case 5:
      halt_baddata();
    case 6:
      *(byte *)(size + 0x6f) = *(byte *)(size + 0x6f) & (byte)(uVar1 >> 8);
      halt_baddata();
    case 7:
      halt_baddata();
    }
    uVar4 = uVar4 & 0x3c | uVar1 & 3;
    if (((uVar4 == 0x20) || (uVar4 == 0x21)) && ((uVar1 & 8) != 0)) {
      uVar1 = uVar1 & 0x1c0 | 2;
      sVar2 = sVar2 + 1;
      iVar3 = 0;
    }
switchD_0011c107_caseD_2c:
  } while (iVar3 == 0);
  if (iVar3 == 5) {
LAB_0011c1f0:
    *statep = uVar1;
    *whereami = sVar2;
    uVar1 = uVar1 >> 3 & 1;
  }
  return uVar1;
}

Assistant:

int /* PRIVATE */
png_check_fp_number(png_const_charp string, size_t size, int *statep,
    png_size_tp whereami)
{
   int state = *statep;
   size_t i = *whereami;

   while (i < size)
   {
      int type;
      /* First find the type of the next character */
      switch (string[i])
      {
      case 43:  type = PNG_FP_SAW_SIGN;                   break;
      case 45:  type = PNG_FP_SAW_SIGN + PNG_FP_NEGATIVE; break;
      case 46:  type = PNG_FP_SAW_DOT;                    break;
      case 48:  type = PNG_FP_SAW_DIGIT;                  break;
      case 49: case 50: case 51: case 52:
      case 53: case 54: case 55: case 56:
      case 57:  type = PNG_FP_SAW_DIGIT + PNG_FP_NONZERO; break;
      case 69:
      case 101: type = PNG_FP_SAW_E;                      break;
      default:  goto PNG_FP_End;
      }

      /* Now deal with this type according to the current
       * state, the type is arranged to not overlap the
       * bits of the PNG_FP_STATE.
       */
      switch ((state & PNG_FP_STATE) + (type & PNG_FP_SAW_ANY))
      {
      case PNG_FP_INTEGER + PNG_FP_SAW_SIGN:
         if ((state & PNG_FP_SAW_ANY) != 0)
            goto PNG_FP_End; /* not a part of the number */

         png_fp_add(state, type);
         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_DOT:
         /* Ok as trailer, ok as lead of fraction. */
         if ((state & PNG_FP_SAW_DOT) != 0) /* two dots */
            goto PNG_FP_End;

         else if ((state & PNG_FP_SAW_DIGIT) != 0) /* trailing dot? */
            png_fp_add(state, type);

         else
            png_fp_set(state, PNG_FP_FRACTION | type);

         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_DIGIT:
         if ((state & PNG_FP_SAW_DOT) != 0) /* delayed fraction */
            png_fp_set(state, PNG_FP_FRACTION | PNG_FP_SAW_DOT);

         png_fp_add(state, type | PNG_FP_WAS_VALID);

         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_E:
         if ((state & PNG_FP_SAW_DIGIT) == 0)
            goto PNG_FP_End;

         png_fp_set(state, PNG_FP_EXPONENT);

         break;

   /* case PNG_FP_FRACTION + PNG_FP_SAW_SIGN:
         goto PNG_FP_End; ** no sign in fraction */

   /* case PNG_FP_FRACTION + PNG_FP_SAW_DOT:
         goto PNG_FP_End; ** Because SAW_DOT is always set */

      case PNG_FP_FRACTION + PNG_FP_SAW_DIGIT:
         png_fp_add(state, type | PNG_FP_WAS_VALID);
         break;

      case PNG_FP_FRACTION + PNG_FP_SAW_E:
         /* This is correct because the trailing '.' on an
          * integer is handled above - so we can only get here
          * with the sequence ".E" (with no preceding digits).
          */
         if ((state & PNG_FP_SAW_DIGIT) == 0)
            goto PNG_FP_End;

         png_fp_set(state, PNG_FP_EXPONENT);

         break;

      case PNG_FP_EXPONENT + PNG_FP_SAW_SIGN:
         if ((state & PNG_FP_SAW_ANY) != 0)
            goto PNG_FP_End; /* not a part of the number */

         png_fp_add(state, PNG_FP_SAW_SIGN);

         break;

   /* case PNG_FP_EXPONENT + PNG_FP_SAW_DOT:
         goto PNG_FP_End; */

      case PNG_FP_EXPONENT + PNG_FP_SAW_DIGIT:
         png_fp_add(state, PNG_FP_SAW_DIGIT | PNG_FP_WAS_VALID);

         break;

   /* case PNG_FP_EXPONEXT + PNG_FP_SAW_E:
         goto PNG_FP_End; */

      default: goto PNG_FP_End; /* I.e. break 2 */
      }

      /* The character seems ok, continue. */
      ++i;
   }

PNG_FP_End:
   /* Here at the end, update the state and return the correct
    * return code.
    */
   *statep = state;
   *whereami = i;

   return (state & PNG_FP_SAW_DIGIT) != 0;
}